

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

bool __thiscall
despot::POMDPX::Step
          (POMDPX *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  Parser *this_00;
  bool bVar1;
  bool bVar2;
  OBS_TYPE OVar3;
  State *state;
  double dVar4;
  double local_38;
  
  state = s + 1;
  local_38 = random_num;
  Parser::GetNextState(this->parser_,(vector<int,_std::allocator<int>_> *)state,action,&local_38);
  dVar4 = Parser::GetReward(this->parser_,action);
  *reward = dVar4;
  OVar3 = Parser::GetObservation
                    (this->parser_,(vector<int,_std::allocator<int>_> *)state,action,&local_38);
  *obs = OVar3;
  this_00 = this->parser_;
  if (this_00->has_terminal_ == true) {
    bVar1 = Parser::IsInTerminalStateSet(this_00,(vector<int,_std::allocator<int>_> *)state);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = Parser::IsSelfLoopingWithoutReward(this_00,(vector<int,_std::allocator<int>_> *)state)
      ;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool POMDPX::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	POMDPXState& state = static_cast<POMDPXState&>(s);

	parser_->GetNextState(state.vec_id, action, random_num);
	reward = parser_->GetReward(action); // Prev state and curr state set in GetNextState
	obs = parser_->GetObservation(state.vec_id, action, random_num);

	return parser_->IsTerminalState(state.vec_id);
}